

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_cmdline.c
# Opt level: O2

void test_archive_cmdline(void)

{
  int iVar1;
  archive_cmdline *paVar2;
  
  paVar2 = __archive_cmdline_allocate();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                   ,L'%',(uint)(paVar2 != (archive_cmdline *)0x0),
                   "(cl = __archive_cmdline_allocate()) != NULL",(void *)0x0);
  if (paVar2 != (archive_cmdline *)0x0) {
    iVar1 = __archive_cmdline_parse(paVar2,"gzip");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                        ,L'(',0,"ARCHIVE_OK",(long)iVar1,"__archive_cmdline_parse(cl, \"gzip\")",
                        (void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                        ,L')',1,"1",(long)paVar2->argc,"cl->argc",(void *)0x0);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
               ,L'*',"gzip","\"gzip\"",paVar2->path,"cl->path",(void *)0x0,L'\0');
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
               ,L'+',"gzip","\"gzip\"",*paVar2->argv,"cl->argv[0]",(void *)0x0,L'\0');
    iVar1 = __archive_cmdline_free(paVar2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                        ,L',',0,"ARCHIVE_OK",(long)iVar1,"__archive_cmdline_free(cl)",(void *)0x0);
    paVar2 = __archive_cmdline_allocate();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                     ,L'.',(uint)(paVar2 != (archive_cmdline *)0x0),
                     "(cl = __archive_cmdline_allocate()) != NULL",(void *)0x0);
    if (paVar2 != (archive_cmdline *)0x0) {
      iVar1 = __archive_cmdline_parse(paVar2,"gzip ");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                          ,L'1',0,"ARCHIVE_OK",(long)iVar1,"__archive_cmdline_parse(cl, \"gzip \")",
                          (void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                          ,L'2',1,"1",(long)paVar2->argc,"cl->argc",(void *)0x0);
      failure("path should not include a space character");
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                 ,L'4',"gzip","\"gzip\"",paVar2->path,"cl->path",(void *)0x0,L'\0');
      failure("arg0 should not include a space character");
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                 ,L'6',"gzip","\"gzip\"",*paVar2->argv,"cl->argv[0]",(void *)0x0,L'\0');
      iVar1 = __archive_cmdline_free(paVar2);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                          ,L'7',0,"ARCHIVE_OK",(long)iVar1,"__archive_cmdline_free(cl)",(void *)0x0)
      ;
      paVar2 = __archive_cmdline_allocate();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                       ,L'9',(uint)(paVar2 != (archive_cmdline *)0x0),
                       "(cl = __archive_cmdline_allocate()) != NULL",(void *)0x0);
      if (paVar2 != (archive_cmdline *)0x0) {
        iVar1 = __archive_cmdline_parse(paVar2,"/usr/bin/gzip ");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                            ,L'=',0,"ARCHIVE_OK",(long)iVar1,
                            "__archive_cmdline_parse(cl, \"/usr/bin/gzip \")",(void *)0x0);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                            ,L'>',1,"1",(long)paVar2->argc,"cl->argc",(void *)0x0);
        failure("path should be a full path");
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                   ,L'@',"/usr/bin/gzip","\"/usr/bin/gzip\"",paVar2->path,"cl->path",(void *)0x0,
                   L'\0');
        failure("arg0 should not be a full path");
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                   ,L'B',"gzip","\"gzip\"",*paVar2->argv,"cl->argv[0]",(void *)0x0,L'\0');
        iVar1 = __archive_cmdline_free(paVar2);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                            ,L'C',0,"ARCHIVE_OK",(long)iVar1,"__archive_cmdline_free(cl)",
                            (void *)0x0);
        paVar2 = __archive_cmdline_allocate();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                         ,L'F',(uint)(paVar2 != (archive_cmdline *)0x0),
                         "(cl = __archive_cmdline_allocate()) != NULL",(void *)0x0);
        if (paVar2 != (archive_cmdline *)0x0) {
          iVar1 = __archive_cmdline_parse(paVar2,"\"gzip \"");
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                              ,L'I',0,"ARCHIVE_OK",(long)iVar1,
                              "__archive_cmdline_parse(cl, \"\\\"gzip \\\"\")",(void *)0x0);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                              ,L'J',1,"1",(long)paVar2->argc,"cl->argc",(void *)0x0);
          failure("path should include a space character");
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                     ,L'L',"gzip ","\"gzip \"",paVar2->path,"cl->path",(void *)0x0,L'\0');
          failure("arg0 should include a space character");
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                     ,L'N',"gzip ","\"gzip \"",*paVar2->argv,"cl->argv[0]",(void *)0x0,L'\0');
          iVar1 = __archive_cmdline_free(paVar2);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                              ,L'O',0,"ARCHIVE_OK",(long)iVar1,"__archive_cmdline_free(cl)",
                              (void *)0x0);
          paVar2 = __archive_cmdline_allocate();
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                           ,L'R',(uint)(paVar2 != (archive_cmdline *)0x0),
                           "(cl = __archive_cmdline_allocate()) != NULL",(void *)0x0);
          if (paVar2 != (archive_cmdline *)0x0) {
            iVar1 = __archive_cmdline_parse(paVar2,"\"gzip \"x");
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                                ,L'U',0,"ARCHIVE_OK",(long)iVar1,
                                "__archive_cmdline_parse(cl, \"\\\"gzip \\\"x\")",(void *)0x0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                                ,L'V',1,"1",(long)paVar2->argc,"cl->argc",(void *)0x0);
            failure("path should include a space character");
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                       ,L'X',"gzip x","\"gzip x\"",paVar2->path,"cl->path",(void *)0x0,L'\0');
            failure("arg0 should include a space character");
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                       ,L'Z',"gzip x","\"gzip x\"",*paVar2->argv,"cl->argv[0]",(void *)0x0,L'\0');
            iVar1 = __archive_cmdline_free(paVar2);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                                ,L'[',0,"ARCHIVE_OK",(long)iVar1,"__archive_cmdline_free(cl)",
                                (void *)0x0);
            paVar2 = __archive_cmdline_allocate();
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                             ,L'^',(uint)(paVar2 != (archive_cmdline *)0x0),
                             "(cl = __archive_cmdline_allocate()) != NULL",(void *)0x0);
            if (paVar2 != (archive_cmdline *)0x0) {
              iVar1 = __archive_cmdline_parse(paVar2,"\"gzip \"x\" s \"");
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                                  ,L'b',0,"ARCHIVE_OK",(long)iVar1,
                                  "__archive_cmdline_parse(cl, \"\\\"gzip \\\"x\\\" s \\\"\")",
                                  (void *)0x0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                                  ,L'c',1,"1",(long)paVar2->argc,"cl->argc",(void *)0x0);
              failure("path should include a space character");
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                         ,L'e',"gzip x s ","\"gzip x s \"",paVar2->path,"cl->path",(void *)0x0,L'\0'
                        );
              failure("arg0 should include a space character");
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                         ,L'g',"gzip x s ","\"gzip x s \"",*paVar2->argv,"cl->argv[0]",(void *)0x0,
                         L'\0');
              iVar1 = __archive_cmdline_free(paVar2);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                                  ,L'h',0,"ARCHIVE_OK",(long)iVar1,"__archive_cmdline_free(cl)",
                                  (void *)0x0);
              paVar2 = __archive_cmdline_allocate();
              assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                               ,L'k',(uint)(paVar2 != (archive_cmdline *)0x0),
                               "(cl = __archive_cmdline_allocate()) != NULL",(void *)0x0);
              if (paVar2 != (archive_cmdline *)0x0) {
                iVar1 = __archive_cmdline_parse(paVar2,"\"gzip\\\" \"");
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                                    ,L'o',0,"ARCHIVE_OK",(long)iVar1,
                                    "__archive_cmdline_parse(cl, \"\\\"gzip\\\\\\\" \\\"\")",
                                    (void *)0x0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                                    ,L'p',1,"1",(long)paVar2->argc,"cl->argc",(void *)0x0);
                failure("path should include a space character");
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                           ,L'r',"gzip\" ","\"gzip\\\" \"",paVar2->path,"cl->path",(void *)0x0,L'\0'
                          );
                failure("arg0 should include a space character");
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                           ,L't',"gzip\" ","\"gzip\\\" \"",*paVar2->argv,"cl->argv[0]",(void *)0x0,
                           L'\0');
                iVar1 = __archive_cmdline_free(paVar2);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                                    ,L'u',0,"ARCHIVE_OK",(long)iVar1,"__archive_cmdline_free(cl)",
                                    (void *)0x0);
                paVar2 = __archive_cmdline_allocate();
                assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                                 ,L'x',(uint)(paVar2 != (archive_cmdline *)0x0),
                                 "(cl = __archive_cmdline_allocate()) != NULL",(void *)0x0);
                if (paVar2 != (archive_cmdline *)0x0) {
                  iVar1 = __archive_cmdline_parse(paVar2,"gzip -d");
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                                      ,L'{',0,"ARCHIVE_OK",(long)iVar1,
                                      "__archive_cmdline_parse(cl, \"gzip -d\")",(void *)0x0);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                                      ,L'|',2,"2",(long)paVar2->argc,"cl->argc",(void *)0x0);
                  assertion_equal_string
                            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                             ,L'}',"gzip","\"gzip\"",paVar2->path,"cl->path",(void *)0x0,L'\0');
                  assertion_equal_string
                            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                             ,L'~',"gzip","\"gzip\"",*paVar2->argv,"cl->argv[0]",(void *)0x0,L'\0');
                  assertion_equal_string
                            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                             ,L'\x7f',"-d","\"-d\"",paVar2->argv[1],"cl->argv[1]",(void *)0x0,L'\0')
                  ;
                  iVar1 = __archive_cmdline_free(paVar2);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                                      ,L'\x80',0,"ARCHIVE_OK",(long)iVar1,
                                      "__archive_cmdline_free(cl)",(void *)0x0);
                  paVar2 = __archive_cmdline_allocate();
                  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                                   ,L'\x83',(uint)(paVar2 != (archive_cmdline *)0x0),
                                   "(cl = __archive_cmdline_allocate()) != NULL",(void *)0x0);
                  if (paVar2 != (archive_cmdline *)0x0) {
                    iVar1 = __archive_cmdline_parse(paVar2,"gzip -d -q");
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                                        ,L'\x86',0,"ARCHIVE_OK",(long)iVar1,
                                        "__archive_cmdline_parse(cl, \"gzip -d -q\")",(void *)0x0);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                                        ,L'\x87',3,"3",(long)paVar2->argc,"cl->argc",(void *)0x0);
                    assertion_equal_string
                              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                               ,L'\x88',"gzip","\"gzip\"",paVar2->path,"cl->path",(void *)0x0,L'\0')
                    ;
                    assertion_equal_string
                              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                               ,L'\x89',"gzip","\"gzip\"",*paVar2->argv,"cl->argv[0]",(void *)0x0,
                               L'\0');
                    assertion_equal_string
                              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                               ,L'\x8a',"-d","\"-d\"",paVar2->argv[1],"cl->argv[1]",(void *)0x0,
                               L'\0');
                    assertion_equal_string
                              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                               ,L'\x8b',"-q","\"-q\"",paVar2->argv[2],"cl->argv[2]",(void *)0x0,
                               L'\0');
                    iVar1 = __archive_cmdline_free(paVar2);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_cmdline.c"
                                        ,L'\x8c',0,"ARCHIVE_OK",(long)iVar1,
                                        "__archive_cmdline_free(cl)",(void *)0x0);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_archive_cmdline)
{
	struct archive_cmdline *cl;

	/* Command name only. */
	assert((cl = __archive_cmdline_allocate()) != NULL);
	if (cl == NULL)
		return;
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_parse(cl, "gzip"));
	assertEqualInt(1, cl->argc);
	assertEqualString("gzip", cl->path);
	assertEqualString("gzip", cl->argv[0]);
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_free(cl));

	assert((cl = __archive_cmdline_allocate()) != NULL);
	if (cl == NULL)
		return;
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_parse(cl, "gzip "));
	assertEqualInt(1, cl->argc);
	failure("path should not include a space character");
	assertEqualString("gzip", cl->path);
	failure("arg0 should not include a space character");
	assertEqualString("gzip", cl->argv[0]);
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_free(cl));

	assert((cl = __archive_cmdline_allocate()) != NULL);
	if (cl == NULL)
		return;
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_parse(cl,
	    "/usr/bin/gzip "));
	assertEqualInt(1, cl->argc);
	failure("path should be a full path");
	assertEqualString("/usr/bin/gzip", cl->path);
	failure("arg0 should not be a full path");
	assertEqualString("gzip", cl->argv[0]);
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_free(cl));

	/* A command line includes space characer. */
	assert((cl = __archive_cmdline_allocate()) != NULL);
	if (cl == NULL)
		return;
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_parse(cl, "\"gzip \""));
	assertEqualInt(1, cl->argc);
	failure("path should include a space character");
	assertEqualString("gzip ", cl->path);
	failure("arg0 should include a space character");
	assertEqualString("gzip ", cl->argv[0]);
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_free(cl));

	/* A command line includes space characer: pattern 2.*/
	assert((cl = __archive_cmdline_allocate()) != NULL);
	if (cl == NULL)
		return;
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_parse(cl, "\"gzip \"x"));
	assertEqualInt(1, cl->argc);
	failure("path should include a space character");
	assertEqualString("gzip x", cl->path);
	failure("arg0 should include a space character");
	assertEqualString("gzip x", cl->argv[0]);
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_free(cl));

	/* A command line includes space characer: pattern 3.*/
	assert((cl = __archive_cmdline_allocate()) != NULL);
	if (cl == NULL)
		return;
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_parse(cl,
	    "\"gzip \"x\" s \""));
	assertEqualInt(1, cl->argc);
	failure("path should include a space character");
	assertEqualString("gzip x s ", cl->path);
	failure("arg0 should include a space character");
	assertEqualString("gzip x s ", cl->argv[0]);
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_free(cl));

	/* A command line includes space characer: pattern 4.*/
	assert((cl = __archive_cmdline_allocate()) != NULL);
	if (cl == NULL)
		return;
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_parse(cl,
	    "\"gzip\\\" \""));
	assertEqualInt(1, cl->argc);
	failure("path should include a space character");
	assertEqualString("gzip\" ", cl->path);
	failure("arg0 should include a space character");
	assertEqualString("gzip\" ", cl->argv[0]);
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_free(cl));

	/* A command name with a argument. */
	assert((cl = __archive_cmdline_allocate()) != NULL);
	if (cl == NULL)
		return;
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_parse(cl, "gzip -d"));
	assertEqualInt(2, cl->argc);
	assertEqualString("gzip", cl->path);
	assertEqualString("gzip", cl->argv[0]);
	assertEqualString("-d", cl->argv[1]);
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_free(cl));

	/* A command name with two arguments. */
	assert((cl = __archive_cmdline_allocate()) != NULL);
	if (cl == NULL)
		return;
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_parse(cl, "gzip -d -q"));
	assertEqualInt(3, cl->argc);
	assertEqualString("gzip", cl->path);
	assertEqualString("gzip", cl->argv[0]);
	assertEqualString("-d", cl->argv[1]);
	assertEqualString("-q", cl->argv[2]);
	assertEqualInt(ARCHIVE_OK, __archive_cmdline_free(cl));
}